

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

Gia_Man_t * Gia_ManFromBridgeReadBody(int Size,uchar *pBuffer,Vec_Int_t **pvInits)

{
  Vec_Int_t **ppVVar1;
  uint uVar2;
  uint nCap;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar7;
  Vec_Int_t *p_02;
  Gia_Man_t *pTemp;
  uint iFan1;
  uint iFan0;
  int nConstraints;
  int nFairness;
  int verFairness;
  int nProps;
  int nGates;
  int nFlops;
  int nInputs;
  int i;
  uchar *pBufferEnd;
  uchar *pBufferPivot;
  Gia_Man_t *p;
  Vec_Int_t *vInits;
  Vec_Int_t *vLits;
  int fHash;
  Vec_Int_t **pvInits_local;
  uchar *pBuffer_local;
  int Size_local;
  
  pvInits_local = (Vec_Int_t **)pBuffer;
  pBuffer_local._4_4_ = Size;
  uVar2 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  nCap = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  uVar3 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  p_00 = Vec_IntAlloc(1000);
  Vec_IntPush(p_00,-999);
  Vec_IntPush(p_00,1);
  p_01 = Gia_ManStart(uVar2 + nCap * 2 + uVar3 + 2);
  pcVar7 = Abc_UtilStrsav("temp");
  p_01->pName = pcVar7;
  for (nFlops = 0; nFlops < (int)uVar2; nFlops = nFlops + 1) {
    iVar4 = Gia_ManAppendCi(p_01);
    Vec_IntPush(p_00,iVar4);
  }
  for (nFlops = 0; nFlops < (int)nCap; nFlops = nFlops + 1) {
    iVar4 = Gia_ManAppendCi(p_01);
    Vec_IntPush(p_00,iVar4);
  }
  for (nFlops = 0; ppVVar1 = pvInits_local, nFlops < (int)uVar3; nFlops = nFlops + 1) {
    uVar2 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
    uVar5 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
    if ((uVar2 & 1) != 0) {
      __assert_fail("!(iFan0 & 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                    ,0x15c,
                    "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
    }
    iVar4 = Vec_IntEntry(p_00,uVar2 >> 2);
    iVar4 = Abc_LitNotCond(iVar4,uVar2 >> 1 & 1);
    iVar6 = Vec_IntEntry(p_00,uVar5 >> 1);
    iVar6 = Abc_LitNotCond(iVar6,uVar5 & 1);
    iVar4 = Gia_ManAppendAnd(p_01,iVar4,iVar6);
    Vec_IntPush(p_00,iVar4);
  }
  for (nFlops = 0; nFlops < (int)nCap; nFlops = nFlops + 1) {
    Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  }
  uVar2 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  for (nFlops = 0; nFlops < (int)uVar2; nFlops = nFlops + 1) {
    uVar3 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
    iVar4 = Vec_IntEntry(p_00,uVar3 >> 1);
    iVar4 = Abc_LitNotCond(iVar4,uVar3 & 1);
    iVar4 = Abc_LitNot(iVar4);
    Gia_ManAppendCo(p_01,iVar4);
  }
  uVar2 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  if (uVar2 != 1) {
    __assert_fail("verFairness == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x17b,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  uVar2 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  if (uVar2 != 0) {
    __assert_fail("nFairness == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x17e,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  uVar2 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
  if (uVar2 != 0) {
    __assert_fail("nConstraints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x181,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  if ((Vec_Int_t **)(pBuffer + Size) != pvInits_local) {
    __assert_fail("pBufferEnd == pBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x184,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  pvInits_local = ppVVar1;
  p_02 = Vec_IntAlloc(nCap);
  nFlops = 0;
  while( true ) {
    if ((int)nCap <= nFlops) {
      Gia_ManSetRegNum(p_01,nCap);
      Vec_IntFree(p_00);
      if (pvInits == (Vec_Int_t **)0x0) {
        Vec_IntFree(p_02);
      }
      else {
        *pvInits = p_02;
      }
      return p_01;
    }
    uVar2 = Gia_AigerReadUnsigned((uchar **)&pvInits_local);
    if ((uVar2 & 3) != 2) break;
    Vec_IntPush(p_02,uVar2 & 3);
    iVar4 = Vec_IntEntry(p_00,uVar2 >> 3);
    iVar4 = Abc_LitNotCond(iVar4,uVar2 >> 2 & 1);
    Gia_ManAppendCo(p_01,iVar4);
    nFlops = nFlops + 1;
  }
  __assert_fail("(iFan0 & 3) == BRIDGE_VALUE_0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                ,0x18c,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
}

Assistant:

Gia_Man_t *  Gia_ManFromBridgeReadBody( int Size, unsigned char * pBuffer, Vec_Int_t ** pvInits )
{
    int fHash = 0;
    Vec_Int_t * vLits, * vInits;
    Gia_Man_t * p = NULL;
    unsigned char * pBufferPivot, * pBufferEnd = pBuffer + Size;
    int i, nInputs, nFlops, nGates, nProps;
    int verFairness, nFairness, nConstraints;
    unsigned iFan0, iFan1;

    nInputs = Gia_AigerReadUnsigned( &pBuffer );
    nFlops  = Gia_AigerReadUnsigned( &pBuffer );
    nGates  = Gia_AigerReadUnsigned( &pBuffer );

    vLits = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLits, -999 );
    Vec_IntPush( vLits,  1 );

    // start the AIG package
    p = Gia_ManStart( nInputs + nFlops * 2 + nGates + 1 + 1 ); // PI+FO+FI+AND+PO+1
    p->pName = Abc_UtilStrsav( "temp" );

    // create PIs
    for ( i = 0; i < nInputs; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create flop outputs
    for ( i = 0; i < nFlops; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create nodes
    if ( fHash )
        Gia_ManHashAlloc( p );
    for ( i = 0; i < nGates; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan1 = Gia_AigerReadUnsigned( &pBuffer );
        assert( !(iFan0 & 1) );
        iFan0 >>= 1;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        iFan1 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan1 >> 1), iFan1 & 1 );
        if ( fHash )
            Vec_IntPush( vLits, Gia_ManHashAnd(p, iFan0, iFan1) );
        else
            Vec_IntPush( vLits, Gia_ManAppendAnd(p, iFan0, iFan1) );

    }
    if ( fHash )
        Gia_ManHashStop( p );

    // remember where flops begin
    pBufferPivot = pBuffer;
    // scroll through flops
    for ( i = 0; i < nFlops; i++ )
        Gia_AigerReadUnsigned( &pBuffer );

    // create POs
    nProps = Gia_AigerReadUnsigned( &pBuffer );
//    assert( nProps == 1 );
    for ( i = 0; i < nProps; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        // complement property output!!!
        Gia_ManAppendCo( p, Abc_LitNot(iFan0) );
    }

    verFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( verFairness == 1 );

    nFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( nFairness == 0 );

    nConstraints = Gia_AigerReadUnsigned( &pBuffer );
    assert( nConstraints == 0);

    // make sure the end of buffer is reached
    assert( pBufferEnd == pBuffer );

    // resetting to flops
    pBuffer = pBufferPivot;
    vInits = Vec_IntAlloc( nFlops );
    for ( i = 0; i < nFlops; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        assert( (iFan0 & 3) == BRIDGE_VALUE_0 );
        Vec_IntPush( vInits, iFan0 & 3 ); // 0 = X value; 1 = not used; 2 = false; 3 = true
        iFan0 >>= 2;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        Gia_ManAppendCo( p, iFan0 );
    }
    Gia_ManSetRegNum( p, nFlops );
    Vec_IntFree( vLits );

    // remove wholes in the node list
    if ( fHash )
    {
        Gia_Man_t * pTemp;
        p = Gia_ManCleanup( pTemp = p );
        Gia_ManStop( pTemp );
    }

    // return
    if ( pvInits )
        *pvInits = vInits;
    else
        Vec_IntFree( vInits );
    return p;
}